

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schemeobject.cpp
# Opt level: O0

string * __thiscall
SchemeSpecialForm::external_repr_abi_cxx11_(string *__return_storage_ptr__,SchemeSpecialForm *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  SchemeSpecialForm *local_18;
  SchemeSpecialForm *this_local;
  
  local_18 = this;
  this_local = (SchemeSpecialForm *)__return_storage_ptr__;
  std::operator+(&local_38,"<special form ",&this->name);
  std::operator+(__return_storage_ptr__,&local_38,">");
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string SchemeSpecialForm::external_repr() const
{
    return "<special form " + name + ">";
}